

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

EC_T_CHAR * SlaveProdCodeText(T_eEtherCAT_Vendor EV,T_eEtherCAT_ProductCode EPC)

{
  char *pcVar1;
  char *pcVar2;
  T_eEtherCAT_Vendor TVar3;
  bool bVar4;
  
  TVar3 = EV;
  do {
    if ((int)TVar3 < 0x126) {
      if ((int)TVar3 < 0x28) {
        if ((int)TVar3 < 4) {
          if (TVar3 == ecvendor_parker) {
            bVar4 = EPC == ecprodcode_par_drive;
LAB_00149862:
            pcVar2 = "Drive";
LAB_00149ad5:
            pcVar1 = "Unknown";
            if (bVar4) {
              pcVar1 = pcVar2;
            }
            return pcVar1;
          }
          if (TVar3 == ecvendor_beckhoff) {
            if ((int)EPC < 0xb583052) {
              if ((int)EPC < 0x4eb3052) {
                if ((int)EPC < 0x44c2c52) {
                  if ((int)EPC < 0x3f63052) {
                    if ((int)EPC < 0x3f03052) {
                      if (EPC == ecprodcode_beck_EL1002) {
                        return "EL1002";
                      }
                      if (EPC == ecprodcode_beck_EL1004) {
                        return "EL1004";
                      }
                    }
                    else {
                      if (EPC == ecprodcode_beck_EL1008) {
                        return "EL1008";
                      }
                      if (EPC == ecprodcode_beck_EL1012) {
                        return "EL1012";
                      }
                    }
                  }
                  else if ((int)EPC < 0x40a3052) {
                    if (EPC == ecprodcode_beck_EL1014) {
                      return "EL1014";
                    }
                    if (EPC == ecprodcode_beck_EL1018) {
                      return "EL1018";
                    }
                  }
                  else {
                    if (EPC == ecprodcode_beck_EL1034) {
                      return "EL1034";
                    }
                    if (EPC == ecprodcode_beck_EL1094) {
                      return "EL1094";
                    }
                  }
                }
                else if ((int)EPC < 0x4570862) {
                  if ((int)EPC < 0x44d2c52) {
                    if (EPC == ecprodcode_beck_EK1100) {
                      return "EK1100";
                    }
                    if (EPC == ecprodcode_beck_CX1100_0004) {
                      return "CX1100 0004";
                    }
                  }
                  else {
                    if (EPC == ecprodcode_beck_EK1101) {
                      return "EK1101";
                    }
                    if (EPC == ecprodcode_beck_EK1110) {
                      return "EK1110";
                    }
                  }
                }
                else if ((int)EPC < 0x4622c52) {
                  if (EPC == ecprodcode_beck_EL9820) {
                    return "EL9820";
                  }
                  if (EPC == ecprodcode_beck_BK1120) {
                    return "BK1120";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EK1122) {
                    return "EK1122";
                  }
                  if (EPC == ecprodcode_beck_CU1128) {
                    return "CU1128";
                  }
                  if (EPC == ecprodcode_beck_EL1252) {
                    return "EL1252";
                  }
                }
              }
              else if ((int)EPC < 0x7d23052) {
                if ((int)EPC < 0x7242c52) {
                  if ((int)EPC < 0x7162c52) {
                    if (EPC == ecprodcode_beck_EL1259) {
                      return "EL1259";
                    }
                    if (EPC == ecprodcode_beck_EL1262) {
                      return "EL1262";
                    }
                  }
                  else {
                    if (EPC == ecprodcode_beck_EK1814) {
                      return "EK1814";
                    }
                    if (EPC == ecprodcode_beck_EK1818) {
                      return "EK1818";
                    }
                  }
                }
                else if ((int)EPC < 0x7703052) {
                  if (EPC == ecprodcode_beck_EK1828) {
                    return "EK1828";
                  }
                  if (EPC == ecprodcode_beck_EL1889) {
                    return "EL1889";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EL1904) {
                    return "EL1904";
                  }
                  if (EPC == ecprodcode_beck_EK1914) {
                    return "EK1914";
                  }
                  if (EPC == ecprodcode_beck_AX2000_B110) {
                    return "AX2000";
                  }
                }
              }
              else if ((int)EPC < 0x8cc3052) {
                if ((int)EPC < 0x7d83052) {
                  if (EPC == ecprodcode_beck_EL2002) {
                    return "EL2002";
                  }
                  if (EPC == ecprodcode_beck_EL2004) {
                    return "EL2004";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EL2008) {
                    return "EL2008";
                  }
                  if (EPC == ecprodcode_beck_EL2032) {
                    return "EL2032";
                  }
                }
              }
              else if ((int)EPC < 0x9c63052) {
                if (EPC == ecprodcode_beck_EL2252) {
                  return "EL2252";
                }
                if (EPC == ecprodcode_beck_EL2262) {
                  return "EL2262";
                }
              }
              else {
                if (EPC == ecprodcode_beck_EL2502) {
                  return "EL2502";
                }
                if (EPC == ecprodcode_beck_EL2521) {
                  return "EL2521";
                }
                if (EPC == ecprodcode_beck_EL2889) {
                  return "EL2889";
                }
              }
            }
            else if ((int)EPC < 0x13893462) {
              if ((int)EPC < 0xcf03052) {
                if ((int)EPC < 0xc463052) {
                  if ((int)EPC < 0xc283052) {
                    if (EPC == ecprodcode_beck_EL2904) {
                      return "EL2904";
                    }
                    if (EPC == ecprodcode_beck_EL3102) {
                      return "EL3102";
                    }
                  }
                  else {
                    if (EPC == ecprodcode_beck_EL3112) {
                      return "EL3112";
                    }
                    if (EPC == ecprodcode_beck_EL3122) {
                      return "EL3122";
                    }
                  }
                }
                else if ((int)EPC < 0xc5a3052) {
                  if (EPC == ecprodcode_beck_EL3142) {
                    return "EL3142";
                  }
                  if (EPC == ecprodcode_beck_EL3152) {
                    return "EL3152";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EL3162) {
                    return "EL3162";
                  }
                  if (EPC == ecprodcode_beck_EL3202) {
                    return "EL3202";
                  }
                }
              }
              else if ((int)EPC < 0x10063052) {
                if ((int)EPC < 0xe763052) {
                  if (EPC == ecprodcode_beck_EL3312) {
                    return "EL3312";
                  }
                  if (EPC == ecprodcode_beck_EL3356) {
                    return "EL3356";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EL3702) {
                    return "EL3702";
                  }
                  if (EPC == ecprodcode_beck_EL4002) {
                    return "EL4002";
                  }
                }
              }
              else if ((int)EPC < 0x101a3052) {
                if (EPC == ecprodcode_beck_EL4102) {
                  return "EL4102";
                }
                if (EPC == ecprodcode_beck_EL4112) {
                  return "EL4112";
                }
              }
              else {
                if (EPC == ecprodcode_beck_EL4122) {
                  return "EL4122";
                }
                if (EPC == ecprodcode_beck_EL4132) {
                  return "EL4132";
                }
                if (EPC == ecprodcode_beck_EL5001) {
                  return "EL5001";
                }
              }
            }
            else if ((int)EPC < 0x1a4b3052) {
              if ((int)EPC < 0x17713052) {
                if ((int)EPC < 0x141f3052) {
                  if (EPC == ecprodcode_beck_FM5001) {
                    return "FM5001";
                  }
                  if (EPC == ecprodcode_beck_EL5101) {
                    return "EL5101";
                  }
                }
                else {
                  if (EPC == ecprodcode_beck_EL5151) {
                    return "EL5151";
                  }
                  if (EPC == ecprodcode_beck_EL5152) {
                    return "EL5152";
                  }
                }
              }
              else if ((int)EPC < 0x19c93052) {
                if (EPC == ecprodcode_beck_EL6001) {
                  return "EL6001";
                }
                if (EPC == ecprodcode_beck_EL6021) {
                  return "EL6021";
                }
              }
              else {
                if (EPC == ecprodcode_beck_EL6601) {
                  return "EL6601";
                }
                if (EPC == ecprodcode_beck_EL6614) {
                  return "EL6614";
                }
                if (EPC == ecprodcode_beck_EL6690) {
                  return "EL6690";
                }
              }
            }
            else if ((int)EPC < 0x1b123052) {
              if ((int)EPC < 0x1a603052) {
                if (EPC == ecprodcode_beck_EL6731) {
                  return "EL6731";
                }
                if (EPC == ecprodcode_beck_EL6751) {
                  return "EL6751";
                }
              }
              else {
                if (EPC == ecprodcode_beck_EL6752) {
                  return "EL6752";
                }
                if (EPC == ecprodcode_beck_EL6900) {
                  return "EL6900";
                }
              }
            }
            else if ((int)EPC < 0x25263052) {
              if (EPC == ecprodcode_beck_EL6930) {
                return "EL6930";
              }
              if (EPC == ecprodcode_beck_EL9505) {
                return "EL9505";
              }
            }
            else {
              if (EPC == ecprodcode_beck_EL9510) {
                return "EL9510";
              }
              if (EPC == ecprodcode_beck_EL9512) {
                return "EL9512";
              }
              if (EPC == ecprodcode_beck_EL9800) {
                return "EL9800";
              }
            }
            goto switchD_001494dc_caseD_10;
          }
          if (TVar3 == ecvendor_scuola_superiore_s_anna) goto switchD_001494dc_caseD_10;
        }
        else {
          switch(TVar3) {
          case ecvendor_pollmeier:
            if (EPC == ecprodcode_esr_Trio_1) {
              return "TrioDrive";
            }
            if (EPC == ecprodcode_esr_Trio) {
              return "TrioDrive";
            }
            if (EPC == ecprodcode_esr_Midi) {
              return "MidiDrive";
            }
          case ecvendor_lust:
            goto switchD_001494dc_caseD_10;
          case ecvendor_lust|ecvendor_etg:
          case ecvendor_lust|ecvendor_beckhoff:
            break;
          case ecvendor_kuebler:
            bVar4 = EPC == ecprodcode_kuebler_Multiturn5868;
            pcVar2 = "Multiturn 5868";
            goto LAB_00149ad5;
          case ecvendor_keb:
            pcVar2 = "Unknown";
            if (EPC == ecprodcode_keb_EcatGateway) {
              pcVar2 = "KEB ECAT Gateway";
            }
            bVar4 = EPC == ecprodcode_keb_KEB1736F5_3d;
            pcVar1 = "KEB1736F5 3.d";
LAB_00149ac6:
            if (!bVar4) {
              pcVar1 = pcVar2;
            }
            return pcVar1;
          default:
            if (TVar3 == ecvendor_ixxat) {
              pcVar2 = "Unknown";
              if (EPC == ecprodcode_ixx_ETCio100) {
                pcVar2 = "ETCio 100";
              }
              bVar4 = EPC == ecprodcode_ixx_iem;
              pcVar1 = "IEM";
              goto LAB_00149ac6;
            }
            if (TVar3 == ecvendor_festo) {
              bVar4 = EPC == ecprodcode_fst_cpx;
              pcVar2 = "CPX";
              goto LAB_00149ad5;
            }
          }
        }
      }
      else if ((int)TVar3 < 0x59) {
        if ((int)TVar3 < 0x44) {
          if (TVar3 == ecvendor_moog) {
            pcVar2 = "Unknown";
            if (EPC == ecprodcode_moog_ServoValveD671) {
              pcVar2 = "Servo Valve D671";
            }
            bVar4 = EPC == ecprodcode_ixx_iem;
            pcVar1 = "Analogue In";
            goto LAB_00149ac6;
          }
          if (TVar3 == ecvendor_lenze) {
            if ((int)EPC < 0x53) {
              if (EPC == ecprodcode_ixx_iem) {
                return "EL9400 L-Force Servo Drive";
              }
              if (EPC == ecprodcode_idam_DSMRW) {
                return "E94AYCET L-Force Servo Drive";
              }
              if (EPC == ecprodcode_ldc_servogun2) {
                return "2 Axis Servo Gun";
              }
            }
            else if ((int)EPC < 0xcd156) {
              if (EPC == ecprodcode_ldc_servogun3) {
                return "3 Axis Servo Gun";
              }
              if (EPC == ecprodcode_ldc_epms130) {
                return "EPM-S130";
              }
            }
            else {
              if (EPC == ecprodcode_ldc_el8400) {
                return "EL8400 L-Force Servo Drive";
              }
              if (EPC == ecprodcode_ldc_stateline) {
                return "Stateline L-Force Servo Drive";
              }
            }
            goto switchD_001494dc_caseD_10;
          }
        }
        else {
          if (TVar3 == ecvendor_hilscher) {
            pcVar2 = "Unknown";
            if (EPC == ecprodcode_hil_NXSB100DC) {
              pcVar2 = "NX SB100 DC";
            }
            bVar4 = EPC == ecprodcode_hil_NXSB100;
            pcVar1 = "NX SB100";
            goto LAB_00149ac6;
          }
          if (TVar3 == ecvendor_komax) {
            bVar4 = EPC == ecprodcode_sh_ACSE;
            pcVar2 = "ACSE";
            goto LAB_00149ad5;
          }
        }
      }
      else if ((int)TVar3 < 0xab) {
        if (TVar3 == ecvendor_sew_eurodrive) {
          pcVar2 = "Unknown";
          if (EPC == ecprodcode_sew_moviaxis) {
            pcVar2 = "Movi Axis";
          }
          bVar4 = EPC == ecprodcode_ixx_iem;
          pcVar1 = "Movi Drive";
          goto LAB_00149ac6;
        }
        if (TVar3 == ecvendor_danaher) {
          bVar4 = EPC == ecprodcode_dan_servostar300;
          pcVar2 = "ServoStar 300";
          goto LAB_00149ad5;
        }
      }
      else {
        if (TVar3 == ecvendor_copley) {
          bVar4 = EPC == ecprodcode_cpl_accelnet;
          pcVar2 = "Accelnet Servo Drive";
          goto LAB_00149ad5;
        }
        if (TVar3 == ecvendor_controltechniques) {
          pcVar2 = "Unknown";
          if (EPC == ecprodcode_ct_drive_sp) {
            pcVar2 = "Emerson Drive SP";
          }
          bVar4 = EPC == ecprodcode_ct_drive;
          pcVar1 = "Emerson Drive";
          goto LAB_00149ac6;
        }
        if (TVar3 == ecvendor_smc) {
          bVar4 = EPC == ecprodcode_smc_serifcunit;
          pcVar2 = "Serif C Unit";
          goto LAB_00149ad5;
        }
      }
    }
    else if ((int)TVar3 < 0x512) {
      if ((int)TVar3 < 0x1f9) {
        if ((int)TVar3 < 0x19d) {
          if (TVar3 == ecvendor_jumo) {
            if ((int)EPC < 0x11111111) {
              if ((int)EPC < 0x2020202) {
                if (EPC == ecprodcode_jumo_Basis) {
                  return "Basismodul";
                }
                if (EPC == ecprodcode_jumo_Router) {
                  return "Router";
                }
              }
              else {
                if (EPC == ecprodcode_jumo_Busskoppler) {
                  return "Busskoppler";
                }
                if (EPC == ecprodcode_jumo_RELAIS) {
                  return "Relais";
                }
                if (EPC == ecprodcode_jumo_HMI) {
                  return "HMI";
                }
              }
            }
            else if ((int)EPC < 0x26483053) {
              if (EPC == ecprodcode_jumo_Analog_4_Ein) {
                return "4 x Analog Eingang";
              }
              if (EPC == ecprodcode_jumo_BIO) {
                return "Basic I/O";
              }
              if (EPC == ecprodcode_jumo_Analog_8_Ein) {
                return "8 x Analog Eingang";
              }
            }
            else {
              if (EPC == ecprodcode_jumo_REGLER) {
                return "Regler";
              }
              if (EPC == ecprodcode_jumo_Analog_4_Aus) {
                return "4 x Analog Ausgang";
              }
              if (EPC == ecprodcode_jumo_Analog_8_Aus) {
                return "8 x Analog Ausgang";
              }
            }
            goto switchD_001494dc_caseD_10;
          }
          if (TVar3 == ecvendor_baumueller) {
            pcVar2 = "Unknown";
            if (EPC == ecprodcode_baumueller_BM4000) {
              pcVar2 = "BM4000";
            }
            bVar4 = EPC == ecprodcode_baumueller_BM3000;
            pcVar1 = "BM3000";
            goto LAB_00149ac6;
          }
        }
        else {
          if (TVar3 == ecvendor_deutschmann) {
            bVar4 = EPC == ecprodcode_beck_EL9800;
            pcVar2 = "RS232 Gateway";
            goto LAB_00149ad5;
          }
          if (TVar3 == ecvendor_robox) {
            bVar4 = EPC == ecprodcode_rx_coedrivegw;
            pcVar2 = "CoE Drive Gateway";
            goto LAB_00149ad5;
          }
        }
      }
      else if ((int)TVar3 < 0x204) {
        if (TVar3 == ecvendor_national_instruments) {
          pcVar2 = "Unknown";
          if (EPC == ecprodcode_ni_anaio) {
            pcVar2 = "Analog I/O";
          }
          bVar4 = EPC == ecprodcode_ni_digio;
          pcVar1 = "Digital I/O";
          goto LAB_00149ac6;
        }
        if (TVar3 == ecvendor_idam) {
          bVar4 = EPC == ecprodcode_idam_DSMRW;
          pcVar2 = "DSMRW";
          goto LAB_00149ad5;
        }
      }
      else {
        if (TVar3 == ecvendor_baumer_th) goto switchD_001494dc_caseD_10;
        if (TVar3 == ecvendor_tr) {
          bVar4 = EPC == ecprodcode_tr_linencoder2;
          pcVar2 = "Line Encoder 2";
          goto LAB_00149ad5;
        }
      }
    }
    else if ((int)TVar3 < 0x777) {
      if ((int)TVar3 < 0x539) {
        if (TVar3 == ecvendor_bce) {
          if (EPC == ecprodcode_bce_AMAT_Handbox) {
            return "AMAT Handbox";
          }
          if (EPC == ecprodcode_bce_AMAT_HB_digout) {
            return "AMAT Handbox Digital Out";
          }
          if (EPC == ecprodcode_bce_AMAT_HB_digin) {
            return "AMAT Handbox Digital In";
          }
          goto switchD_001494dc_caseD_10;
        }
        if (TVar3 == ecvendor_dresdenelektronik) {
          bVar4 = EPC == ecprodcode_de_sdac3100;
          pcVar2 = "de axis controller 3100";
          goto LAB_00149ad5;
        }
      }
      else {
        if (TVar3 == ecvendor_yaskawa) {
          bVar4 = EPC == ecprodcode_yas_sgdv_e1;
          pcVar2 = "SGDV-E1 CoE Drive";
          goto LAB_00149ad5;
        }
        if (TVar3 == ecvendor_renesas) {
          bVar4 = EPC == ecprodcode_ren_EC1;
          pcVar2 = "EC-1";
          goto LAB_00149ad5;
        }
      }
    }
    else if ((int)TVar3 < 0x60c8) {
      if (TVar3 == ecvendor_koenig) {
        bVar4 = EPC == ecprodcode_kng_pc104;
        pcVar2 = "PC104";
        goto LAB_00149ad5;
      }
      if (TVar3 == ecvendor_acontis) {
        pcVar2 = "Unknown";
        if (EPC == ecprodcode_at_atemTestSlave) {
          pcVar2 = "EtherCAT TestSlave";
        }
        bVar4 = EPC == ecprodcode_at_atem;
        pcVar1 = "EtherCAT Master";
        goto LAB_00149ac6;
      }
    }
    else {
      if (TVar3 == ecvendor_kuka) {
        if ((int)EPC < 0x101) {
          if (EPC == ecprodcode_ixx_iem) {
            return "CIB";
          }
          if (EPC == ecprodcode_bce_AMAT_HB_digin) {
            return "RDC 3 angle resolver";
          }
        }
        else {
          if (EPC == ecprodcode_kr_cibsion) {
            return "CIB-SION";
          }
          if (EPC == ecprodcode_kr_sionkpp) {
            return "SION-KPP";
          }
          if (EPC == ecprodcode_kr_sionksp) {
            return "SION-KSP";
          }
        }
        goto switchD_001494dc_caseD_10;
      }
      if (TVar3 == ecvendor_kuhnke) {
        pcVar2 = "Unknown";
        if (EPC == ecprodcode_kuh_VFIO_DIO) {
          pcVar2 = "Digital I/O";
        }
        bVar4 = EPC == ecprodcode_kuh_VFIO_BK;
        pcVar1 = "BK";
        goto LAB_00149ac6;
      }
      if (TVar3 == ecvendor_jat) {
        bVar4 = EPC == ecprodcode_ixx_iem;
        goto LAB_00149862;
      }
    }
    bVar4 = TVar3 < 0xe0000000;
    TVar3 = EV & 0x1fffffff;
    if (bVar4) {
switchD_001494dc_caseD_10:
      return "Unknown";
    }
  } while( true );
}

Assistant:

EC_T_CHAR* SlaveProdCodeText(
    T_eEtherCAT_Vendor      EV,     /**< [in]   Vendor ID */
    T_eEtherCAT_ProductCode EPC     /**< [in]   Product Code */
)
{
    EC_T_CHAR* pRet = EC_NULL;

    switch (EV)
    {
    case ecvendor_beckhoff:
        {
            switch (EPC)
            {
            case ecprodcode_beck_AX2000_B110:   pRet  = (EC_T_CHAR*)"AX2000"; break;
         /* case ecprodcode_beck_AX2000_B110:   pRet  = (EC_T_CHAR*)"AX2000 B110"; break; */
         /* case ecprodcode_beck_AX2000_B120:   pRet  = (EC_T_CHAR*)"AX2000 B120"; break; */
            case ecprodcode_beck_BK1120:        pRet  = (EC_T_CHAR*)"BK1120"; break;
            case ecprodcode_beck_CX1100_0004:   pRet  = (EC_T_CHAR*)"CX1100 0004"; break;
            case ecprodcode_beck_CU1128:        pRet  = (EC_T_CHAR*)"CU1128"; break;
            case ecprodcode_beck_EK1100:        pRet  = (EC_T_CHAR*)"EK1100"; break;
            case ecprodcode_beck_EK1101:        pRet  = (EC_T_CHAR*)"EK1101"; break;
            case ecprodcode_beck_EK1110:        pRet  = (EC_T_CHAR*)"EK1110"; break;
            case ecprodcode_beck_EK1122:        pRet  = (EC_T_CHAR*)"EK1122"; break;
            case ecprodcode_beck_EK1814:        pRet  = (EC_T_CHAR*)"EK1814"; break;
            case ecprodcode_beck_EK1818:        pRet  = (EC_T_CHAR*)"EK1818"; break;
            case ecprodcode_beck_EK1828:        pRet  = (EC_T_CHAR*)"EK1828"; break;
            case ecprodcode_beck_EK1914:        pRet  = (EC_T_CHAR*)"EK1914"; break;
            case ecprodcode_beck_EL1002:        pRet  = (EC_T_CHAR*)"EL1002"; break;
            case ecprodcode_beck_EL1004:        pRet  = (EC_T_CHAR*)"EL1004"; break;
         /* case ecprodcode_beck_EL1004_0010:   pRet  = (EC_T_CHAR*)"EL1004 0010"; break; */
            case ecprodcode_beck_EL1008:        pRet  = (EC_T_CHAR*)"EL1008"; break;
            case ecprodcode_beck_EL1012:        pRet  = (EC_T_CHAR*)"EL1012"; break;
            case ecprodcode_beck_EL1014:        pRet  = (EC_T_CHAR*)"EL1014"; break;
         /* case ecprodcode_beck_EL1014_0010:   pRet  = (EC_T_CHAR*)"EL1014 0010"; break; */
            case ecprodcode_beck_EL1018:        pRet  = (EC_T_CHAR*)"EL1018"; break;
            case ecprodcode_beck_EL1034:        pRet  = (EC_T_CHAR*)"EL1034"; break;
            case ecprodcode_beck_EL1094:        pRet  = (EC_T_CHAR*)"EL1094"; break;
            case ecprodcode_beck_EL1252:        pRet  = (EC_T_CHAR*)"EL1252"; break;
            case ecprodcode_beck_EL1259:        pRet  = (EC_T_CHAR*)"EL1259"; break;
            case ecprodcode_beck_EL1262:        pRet  = (EC_T_CHAR*)"EL1262"; break;
            case ecprodcode_beck_EL1904:        pRet  = (EC_T_CHAR*)"EL1904"; break;
            case ecprodcode_beck_EL1889:        pRet  = (EC_T_CHAR*)"EL1889"; break;

            case ecprodcode_beck_EL2002:        pRet  = (EC_T_CHAR*)"EL2002"; break;
            case ecprodcode_beck_EL2004:        pRet  = (EC_T_CHAR*)"EL2004"; break;
            case ecprodcode_beck_EL2008:        pRet  = (EC_T_CHAR*)"EL2008"; break;
            case ecprodcode_beck_EL2032:        pRet  = (EC_T_CHAR*)"EL2032"; break;
            case ecprodcode_beck_EL2262:        pRet  = (EC_T_CHAR*)"EL2262"; break;
            case ecprodcode_beck_EL2252:        pRet  = (EC_T_CHAR*)"EL2252"; break;
            case ecprodcode_beck_EL2502:        pRet  = (EC_T_CHAR*)"EL2502"; break;
            case ecprodcode_beck_EL2521:        pRet  = (EC_T_CHAR*)"EL2521"; break;
         /* case ecprodcode_beck_EL2521_1001:   pRet  = (EC_T_CHAR*)"EL2521 0001"; break; */
            case ecprodcode_beck_EL2889:        pRet  = (EC_T_CHAR*)"EL2889"; break;
            case ecprodcode_beck_EL2904:        pRet  = (EC_T_CHAR*)"EL2904"; break;
            case ecprodcode_beck_EL3102:        pRet  = (EC_T_CHAR*)"EL3102"; break;
            case ecprodcode_beck_EL3112:        pRet  = (EC_T_CHAR*)"EL3112"; break;
            case ecprodcode_beck_EL3122:        pRet  = (EC_T_CHAR*)"EL3122"; break;
            case ecprodcode_beck_EL3142:        pRet  = (EC_T_CHAR*)"EL3142"; break;
         /* case ecprodcode_beck_EL3142_0010:   pRet  = (EC_T_CHAR*)"EL3142 0010"; break; */
            case ecprodcode_beck_EL3152:        pRet  = (EC_T_CHAR*)"EL3152"; break;
            case ecprodcode_beck_EL3162:        pRet  = (EC_T_CHAR*)"EL3162"; break;
            case ecprodcode_beck_EL3202:        pRet  = (EC_T_CHAR*)"EL3202"; break;
            case ecprodcode_beck_EL3312:        pRet  = (EC_T_CHAR*)"EL3312"; break;
            case ecprodcode_beck_EL3356:        pRet  = (EC_T_CHAR*)"EL3356"; break;
            case ecprodcode_beck_EL3702:        pRet  = (EC_T_CHAR*)"EL3702"; break;
            case ecprodcode_beck_EL4002:        pRet  = (EC_T_CHAR*)"EL4002"; break;
            case ecprodcode_beck_EL4102:        pRet  = (EC_T_CHAR*)"EL4102"; break;
            case ecprodcode_beck_EL4112:        pRet  = (EC_T_CHAR*)"EL4112"; break;
         /* case ecprodcode_beck_EL4112_0010:   pRet  = (EC_T_CHAR*)"EL4112 0010"; break; */
            case ecprodcode_beck_EL4122:        pRet  = (EC_T_CHAR*)"EL4122"; break;
            case ecprodcode_beck_EL4132:        pRet  = (EC_T_CHAR*)"EL4132"; break;
            case ecprodcode_beck_EL5001:        pRet  = (EC_T_CHAR*)"EL5001"; break;
            case ecprodcode_beck_EL5101:        pRet  = (EC_T_CHAR*)"EL5101"; break;
            case ecprodcode_beck_EL5151:        pRet  = (EC_T_CHAR*)"EL5151"; break;
            case ecprodcode_beck_EL5152:        pRet  = (EC_T_CHAR*)"EL5152"; break;
            case ecprodcode_beck_EL6001:        pRet  = (EC_T_CHAR*)"EL6001"; break;
            case ecprodcode_beck_EL6021:        pRet  = (EC_T_CHAR*)"EL6021"; break;
            case ecprodcode_beck_EL6601:        pRet  = (EC_T_CHAR*)"EL6601"; break;
            case ecprodcode_beck_EL6614:        pRet  = (EC_T_CHAR*)"EL6614"; break;
            case ecprodcode_beck_EL6690:        pRet  = (EC_T_CHAR*)"EL6690"; break;
            case ecprodcode_beck_EL6731:        pRet  = (EC_T_CHAR*)"EL6731"; break;
         /* case ecprodcode_beck_EL6731_0010:   pRet  = (EC_T_CHAR*)"EL6731 0010"; break; */
            case ecprodcode_beck_EL6751:        pRet  = (EC_T_CHAR*)"EL6751"; break;
            case ecprodcode_beck_EL6752:        pRet  = (EC_T_CHAR*)"EL6752"; break;

            case ecprodcode_beck_EL6900:        pRet  = (EC_T_CHAR*)"EL6900"; break;
            case ecprodcode_beck_EL6930:        pRet  = (EC_T_CHAR*)"EL6930"; break;
            case ecprodcode_beck_EL9505:        pRet  = (EC_T_CHAR*)"EL9505"; break;
            case ecprodcode_beck_EL9510:        pRet  = (EC_T_CHAR*)"EL9510"; break;
            case ecprodcode_beck_EL9512:        pRet  = (EC_T_CHAR*)"EL9512"; break;
            case ecprodcode_beck_EL9800:        pRet  = (EC_T_CHAR*)"EL9800"; break;
            case ecprodcode_beck_EL9820:        pRet  = (EC_T_CHAR*)"EL9820"; break;
            case ecprodcode_beck_FM5001:        pRet  = (EC_T_CHAR*)"FM5001"; break;

            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
#if !(defined EC_DEMO_TINY)
    case ecvendor_scuola_superiore_s_anna:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_ixxat:
        {
            switch (EPC)
            {
            case ecprodcode_ixx_iem:            pRet  = (EC_T_CHAR*)"IEM"; break;
            case ecprodcode_ixx_ETCio100:       pRet  = (EC_T_CHAR*)"ETCio 100"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_pollmeier:
        {
            switch (EPC)
            {
            case ecprodcode_esr_Trio_1:
            case ecprodcode_esr_Trio:           pRet  = (EC_T_CHAR*)"TrioDrive"; break;
            case ecprodcode_esr_Midi:           pRet  = (EC_T_CHAR*)"MidiDrive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_lust:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_kuebler:
        {
            switch (EPC)
            {
            case ecprodcode_kuebler_Multiturn5868:
                pRet  = (EC_T_CHAR*)"Multiturn 5868"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_keb:
        {
            switch (EPC)
            {
            case ecprodcode_keb_KEB1736F5_3d:   pRet  = (EC_T_CHAR*)"KEB1736F5 3.d"; break;
            case ecprodcode_keb_EcatGateway:    pRet  = (EC_T_CHAR*)"KEB ECAT Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_moog:
        {
            switch (EPC)
            {
            case ecprodcode_moog_anin:          pRet  = (EC_T_CHAR*)"Analogue In"; break;
            case ecprodcode_moog_ServoValveD671:pRet  = (EC_T_CHAR*)"Servo Valve D671"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_lenze:
        {
            switch (EPC)
            {
            case ecprodcode_ldc_el9400:         pRet  = (EC_T_CHAR*)"EL9400 L-Force Servo Drive"; break;
            case ecprodcode_ldc_e94aycet:       pRet  = (EC_T_CHAR*)"E94AYCET L-Force Servo Drive"; break;
            case ecprodcode_ldc_servogun2:      pRet  = (EC_T_CHAR*)"2 Axis Servo Gun"; break;
            case ecprodcode_ldc_servogun3:      pRet  = (EC_T_CHAR*)"3 Axis Servo Gun"; break;
            case ecprodcode_ldc_epms130:        pRet  = (EC_T_CHAR*)"EPM-S130"; break;
            case ecprodcode_ldc_el8400:         pRet  = (EC_T_CHAR*)"EL8400 L-Force Servo Drive"; break;
            case ecprodcode_ldc_stateline:      pRet  = (EC_T_CHAR*)"Stateline L-Force Servo Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_hilscher:
        {
            switch (EPC)
            {
            case ecprodcode_hil_NXSB100:        pRet  = (EC_T_CHAR*)"NX SB100"; break;
            case ecprodcode_hil_NXSB100DC:      pRet  = (EC_T_CHAR*)"NX SB100 DC"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_renesas:
        {
            switch (EPC)
            {
            case ecprodcode_ren_EC1:            pRet = (EC_T_CHAR*)"EC-1"; break;
            default:                            pRet = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_komax:
        {
            switch (EPC)
            {
            case ecprodcode_sh_ACSE:            pRet  = (EC_T_CHAR*)"ACSE"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };;
        } break;
    case ecvendor_sew_eurodrive:
        {
            switch (EPC)
            {
            case ecprodcode_sew_movidrive:      pRet  = (EC_T_CHAR*)"Movi Drive"; break;
            case ecprodcode_sew_moviaxis:       pRet  = (EC_T_CHAR*)"Movi Axis"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_danaher:
        {
            switch (EPC)
            {
            case ecprodcode_dan_servostar300:   pRet  = (EC_T_CHAR*)"ServoStar 300"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_controltechniques:
        {
            switch (EPC)
            {
            case ecprodcode_ct_drive:           pRet  = (EC_T_CHAR*)"Emerson Drive"; break;
            case ecprodcode_ct_drive_sp:        pRet  = (EC_T_CHAR*)"Emerson Drive SP"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_smc:
        {
            switch (EPC)
            {
            case ecprodcode_smc_serifcunit:     pRet  = (EC_T_CHAR*)"Serif C Unit"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_jumo:
        {
            switch (EPC)
            {
            case ecprodcode_jumo_Basis:         pRet  = (EC_T_CHAR*)"Basismodul"; break;
            case ecprodcode_jumo_Busskoppler:   pRet  = (EC_T_CHAR*)"Busskoppler"; break;
            case ecprodcode_jumo_HMI:           pRet  = (EC_T_CHAR*)"HMI"; break;
            case ecprodcode_jumo_Router:        pRet  = (EC_T_CHAR*)"Router"; break;
            case ecprodcode_jumo_BIO:           pRet  = (EC_T_CHAR*)"Basic I/O"; break;
            case ecprodcode_jumo_RELAIS:        pRet  = (EC_T_CHAR*)"Relais"; break;
            case ecprodcode_jumo_REGLER:        pRet  = (EC_T_CHAR*)"Regler"; break;
            case ecprodcode_jumo_Analog_4_Ein:  pRet  = (EC_T_CHAR*)"4 x Analog Eingang"; break;
            case ecprodcode_jumo_Analog_8_Ein:  pRet  = (EC_T_CHAR*)"8 x Analog Eingang"; break;
            case ecprodcode_jumo_Analog_4_Aus:  pRet  = (EC_T_CHAR*)"4 x Analog Ausgang"; break;
            case ecprodcode_jumo_Analog_8_Aus:  pRet  = (EC_T_CHAR*)"8 x Analog Ausgang"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_baumueller:
        {
            switch (EPC)
            {
            case ecprodcode_baumueller_BM3000:  pRet  = (EC_T_CHAR*)"BM3000"; break;
            case ecprodcode_baumueller_BM4000:  pRet  = (EC_T_CHAR*)"BM4000"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_deutschmann:
        {
            switch (EPC)
            {
            case ecprodcode_dm_rs232gw:         pRet  = (EC_T_CHAR*)"RS232 Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_parker:
        {
            switch (EPC)
            {
            case ecprodcode_par_drive:          pRet  = (EC_T_CHAR*)"Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_national_instruments:
        {
            switch (EPC)
            {
            case ecprodcode_ni_digio:           pRet  = (EC_T_CHAR*)"Digital I/O"; break;
            case ecprodcode_ni_anaio:           pRet  = (EC_T_CHAR*)"Analog I/O"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_idam:
        {
            switch (EPC)
            {
            case ecprodcode_idam_DSMRW:         pRet  = (EC_T_CHAR*)"DSMRW"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_baumer_th:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_tr:
        {
            switch (EPC)
            {
            case ecprodcode_tr_linencoder2:     pRet  = (EC_T_CHAR*)"Line Encoder 2"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_bce:
        {
            switch (EPC)
            {
            case ecprodcode_bce_AMAT_Handbox:   pRet  = (EC_T_CHAR*)"AMAT Handbox"; break;
            case ecprodcode_bce_AMAT_HB_digin:  pRet  = (EC_T_CHAR*)"AMAT Handbox Digital In"; break;
            case ecprodcode_bce_AMAT_HB_digout: pRet  = (EC_T_CHAR*)"AMAT Handbox Digital Out"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_koenig:
        {
            switch (EPC)
            {
            case ecprodcode_kng_pc104:          pRet  = (EC_T_CHAR*)"PC104"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_acontis:
        {
            switch (EPC)
            {
            case ecprodcode_at_atem:            pRet  = (EC_T_CHAR*)"EtherCAT Master"; break;
            case ecprodcode_at_atemTestSlave:   pRet  = (EC_T_CHAR*)"EtherCAT TestSlave"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_kuka:
        {
            switch (EPC)
            {
            case ecprodcode_kr_cib:             pRet  = (EC_T_CHAR*)"CIB"; break;
            case ecprodcode_kr_rdc3:            pRet  = (EC_T_CHAR*)"RDC 3 angle resolver"; break;
            case ecprodcode_kr_cibsion:         pRet  = (EC_T_CHAR*)"CIB-SION"; break;
            case ecprodcode_kr_sionkpp:         pRet  = (EC_T_CHAR*)"SION-KPP"; break;
            case ecprodcode_kr_sionksp:         pRet  = (EC_T_CHAR*)"SION-KSP"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_kuhnke:
        {
            switch (EPC)
            {
            case ecprodcode_kuh_VFIO_BK:        pRet  = (EC_T_CHAR*)"BK"; break;
            case ecprodcode_kuh_VFIO_DIO:       pRet  = (EC_T_CHAR*)"Digital I/O"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_jat:
        {
            switch (EPC)
            {
            case ecprodcode_jat_drive1:         pRet  = (EC_T_CHAR*)"Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_festo:
        {
            switch (EPC)
            {
            case ecprodcode_fst_cpx:            pRet  = (EC_T_CHAR*)"CPX"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_copley:
        {
            switch (EPC)
            {
            case ecprodcode_cpl_accelnet:       pRet  = (EC_T_CHAR*)"Accelnet Servo Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_robox:
        {
            switch (EPC)
            {
            case ecprodcode_rx_coedrivegw:      pRet  = (EC_T_CHAR*)"CoE Drive Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_dresdenelektronik:
        {
            switch (EPC)
            {
            case ecprodcode_de_sdac3100:        pRet  = (EC_T_CHAR*)"de axis controller 3100"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_yaskawa:
        {
            switch (EPC)
            {
            case ecprodcode_yas_sgdv_e1:        pRet  = (EC_T_CHAR*)"SGDV-E1 CoE Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
#endif /*#if !(defined EC_DEMO_TINY)*/
    default:
        if (0xE0000000 == (((EC_T_DWORD)EV)&0xE0000000))
        {
            pRet = SlaveProdCodeText((T_eEtherCAT_Vendor)(((EC_T_DWORD)EV)&(~0xe0000000)), EPC);
        }
        else
        {
            pRet = (EC_T_CHAR*)"Unknown";
        }
    }

    return pRet;
}